

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

vector4 * vector4_subtractf(vector4 *self,double f)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (self->field_0).v[1];
  dVar2 = (self->field_0).v[2];
  dVar3 = (self->field_0).v[3];
  (self->field_0).v[0] = (self->field_0).v[0] - f;
  (self->field_0).v[1] = dVar1 - f;
  (self->field_0).v[2] = dVar2 - f;
  (self->field_0).v[3] = dVar3 - f;
  return self;
}

Assistant:

HYPAPI struct vector4 *vector4_subtractf(struct vector4 *self, HYP_FLOAT f)
{
	self->x -= f;
	self->y -= f;
	self->z -= f;
	self->w -= f;
	return self;
}